

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling.cpp
# Opt level: O0

void Al::internal::profiling::name_thread(native_handle_type handle,string *name)

{
  char *__name;
  ulong in_RSI;
  pthread_t in_RDI;
  string name_resized;
  string local_30 [40];
  pthread_t local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::substr((ulong)local_30,in_RSI);
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(local_8,__name);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void name_thread([[maybe_unused]] std::thread::native_handle_type handle,
                 [[maybe_unused]] std::string name) {
#ifdef AL_HAS_NVPROF
  nvtxNameOsThreadA(handle, name.c_str());
#endif
#ifdef _GNU_SOURCE
  // Subtract 1 to account for the terminating null.
  std::string name_resized = name.substr(0, AL_MAX_THREAD_NAME_LEN - 1);
  pthread_setname_np(handle, name_resized.c_str());
#endif
}